

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

string * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::getName_abi_cxx11_
          (ThreeAxisForceTorqueContactSensor *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,*(string **)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string ThreeAxisForceTorqueContactSensor::getName() const
{
    return this->pimpl->name;
}